

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::WATParser::Limits> *
wasm::WATParser::limits32<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::Limits> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  optional<unsigned_int> oVar3;
  optional<unsigned_int> oVar4;
  string local_68;
  Err local_48;
  
  oVar3 = Lexer::takeU<unsigned_int>(&ctx->in);
  if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"expected initial size","");
    Lexer::err(&local_48,&ctx->in,&local_68);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> = puVar1;
    paVar2 = &local_48.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                         local_48.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>
               .super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x18) =
           local_48.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> =
           local_48.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x10) =
           CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                    local_48.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 8) =
         local_48.msg._M_string_length;
    local_48.msg._M_string_length = 0;
    local_48.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      local_48.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    oVar4 = Lexer::takeU<unsigned_int>(&ctx->in);
    *(ulong *)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>
               .super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> =
         (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 8) =
         (ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    *(byte *)((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x10) =
         oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged & 1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits32(Ctx& ctx) {
  auto n = ctx.in.takeU32();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU32();
  return ctx.makeLimits(uint64_t(*n), m);
}